

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound.cpp
# Opt level: O0

void __thiscall
XPMP2::SoundSystemXP::SetPosOrientation
          (SoundSystemXP *this,uint64_t sndId,Aircraft *ac,bool bDoOrientation)

{
  bool bVar1;
  byte in_CL;
  Aircraft *in_RDX;
  FMOD_VECTOR FVar2;
  FMOD_VECTOR coneVec;
  float coneDirRad;
  FMOD_VECTOR fmodVel;
  FMOD_VECTOR fmodPos;
  SoundChannel *pChn;
  FmodError *in_stack_fffffffffffffd90;
  FmodError *this_00;
  uint64_t in_stack_fffffffffffffda0;
  SoundSystem *in_stack_fffffffffffffda8;
  FmodError *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  allocator<char> local_219;
  string local_218 [12];
  float in_stack_fffffffffffffdf4;
  float in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  int in_stack_fffffffffffffe04;
  string *in_stack_fffffffffffffe08;
  string local_1f0 [4];
  undefined4 in_stack_fffffffffffffe14;
  string *in_stack_fffffffffffffe18;
  FmodError *in_stack_fffffffffffffe20;
  allocator<char> local_1c9;
  string local_1c8 [128];
  FMOD_VECTOR local_148;
  undefined8 local_134;
  float local_12c;
  float local_128;
  undefined1 local_121 [40];
  undefined1 local_f9 [56];
  allocator<char> local_c1;
  string local_c0 [128];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  SoundChannel *local_28;
  byte local_19;
  Aircraft *local_18;
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_28 = SoundSystem::GetChn(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
  bVar1 = XPSoundIsAvail();
  if ((((bVar1) && (local_28 != (SoundChannel *)0x0)) && (local_28->pChn != (FMOD_CHANNEL *)0x0)) &&
     (local_28->pSnd != (SoundFile *)0x0)) {
    local_34 = (local_18->drawInfo).x;
    local_30 = (local_18->drawInfo).y;
    local_2c = (local_18->drawInfo).z;
    local_40 = local_18->v_x;
    local_3c = local_18->v_y;
    local_38 = local_18->v_z;
    gFmodRes = (*gpXPLMSetAudioPosition)(local_28->pChn,&local_34,&local_40);
    if (gFmodRes != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdd0,
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (allocator<char> *)in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdd0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f9;
      in_stack_fffffffffffffdcc = gFmodRes;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdd0,
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (allocator<char> *)in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc0 = (FmodError *)local_121;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdd0,
                 (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                 (allocator<char> *)in_stack_fffffffffffffdc0);
      FmodError::FmodError
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                 in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                 (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      FmodError::LogErr(in_stack_fffffffffffffdc0);
      FmodError::~FmodError(in_stack_fffffffffffffd90);
      std::__cxx11::string::~string((string *)(local_121 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_121);
      std::__cxx11::string::~string((string *)(local_f9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f9);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
    }
    if (((local_19 & 1) != 0) &&
       (bVar1 = SoundFile::hasConeInfo((SoundFile *)in_stack_fffffffffffffd90), bVar1)) {
      local_128 = deg2rad<float>(local_28->pSnd->coneDir);
      Aircraft::GetHeading(local_18);
      std::cos((double)(ulong)(uint)local_128);
      Aircraft::GetPitch(local_18);
      std::sin((double)(ulong)(uint)local_128);
      Aircraft::GetRoll(local_18);
      FVar2 = FmodHeadPitch2Vec(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
      local_148._0_8_ = FVar2._0_8_;
      local_134._0_4_ = local_148.x;
      local_134._4_4_ = local_148.y;
      local_148.z = FVar2.z;
      local_12c = local_148.z;
      local_148 = FVar2;
      gFmodRes = (*gpXPLMSetAudioCone)
                           (local_28->pSnd->coneInAngle,local_28->pSnd->coneOutAngle,
                            local_28->pSnd->coneOutVol,local_28->pChn,&local_134);
      if (gFmodRes != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdd0,
                   (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (allocator<char> *)in_stack_fffffffffffffdc0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdd0,
                   (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (allocator<char> *)in_stack_fffffffffffffdc0);
        this_00 = (FmodError *)&local_219;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffdd0,
                   (char *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                   (allocator<char> *)in_stack_fffffffffffffdc0);
        FmodError::FmodError
                  (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe14,
                   in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                   (string *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        FmodError::LogErr(in_stack_fffffffffffffdc0);
        FmodError::~FmodError(this_00);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator(&local_219);
        std::__cxx11::string::~string(local_1f0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe0f);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator(&local_1c9);
      }
    }
  }
  return;
}

Assistant:

void SoundSystemXP::SetPosOrientation (uint64_t sndId, const Aircraft& ac, bool bDoOrientation)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!XPSoundIsAvail() || !pChn || !pChn->pChn || !pChn->pSnd ) return;
    
    // Aircraft position and velocity
    FMOD_VECTOR fmodPos {                           // Copy of the aircraft's 3D location
        ac.drawInfo.x,
        ac.drawInfo.y,
        ac.drawInfo.z,
    };
    FMOD_VECTOR fmodVel { ac.v_x, ac.v_y, ac.v_z }; // Copy of the aircraft's relative speed
    FMOD_LOG(gpXPLMSetAudioPosition(pChn->pChn, &fmodPos, &fmodVel));
    
    // Do the (computationally more expensive) orientation stuff?
    if (!bDoOrientation ||
        !pChn->pSnd->hasConeInfo()) return;
    
    // Calculate current cone orientation based on standard orientation and aircraft orientation
    const float coneDirRad = deg2rad(pChn->pSnd->coneDir);
    FMOD_VECTOR coneVec = FmodHeadPitch2Vec(ac.GetHeading() + pChn->pSnd->coneDir,
                                            std::cos(coneDirRad)*ac.GetPitch() - std::sin(coneDirRad)*ac.GetRoll() + pChn->pSnd->conePitch);

    // Set cone info and orientation
    FMOD_LOG(gpXPLMSetAudioCone(pChn->pChn,
                                pChn->pSnd->coneInAngle,
                                pChn->pSnd->coneOutAngle,
                                pChn->pSnd->coneOutVol,
                                &coneVec));
}